

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

void __thiscall
ThreadContext::ThreadContext
          (ThreadContext *this,AllocationPolicyManager *allocationPolicyManager,
          ThreadServiceCallback threadServiceCallback,bool enableExperimentalFeatures)

{
  IdleDecommitPageAllocator *this_00;
  ArenaAllocator *this_01;
  ArenaAllocator *this_02;
  DWORD DVar1;
  uint uVar2;
  HANDLE pVVar3;
  Stack<HostScriptContext_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *pSVar4;
  void **ppvVar5;
  DynamicProfileMutator *pDVar6;
  ThreadContext *this_03;
  AutoCriticalSection local_50;
  AutoCriticalSection autocs;
  
  (this->super_DefaultRecyclerCollectionWrapper).super_RecyclerCollectionWrapper.
  _isScriptContextCloseGCPending = 0;
  (this->super_DefaultRecyclerCollectionWrapper).super_RecyclerCollectionWrapper.
  _vptr_RecyclerCollectionWrapper = (_func_int **)&PTR_PreCollectionCallBack_01376408;
  (this->super_DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>).previous = (Type)0x0;
  (this->super_DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>).next = (Type)0x0;
  ThreadContextInfo::ThreadContextInfo(&this->super_ThreadContextInfo);
  (this->super_DefaultRecyclerCollectionWrapper).super_RecyclerCollectionWrapper.
  _vptr_RecyclerCollectionWrapper = (_func_int **)&PTR_PreCollectionCallBack_01379140;
  (this->super_ThreadContextInfo)._vptr_ThreadContextInfo =
       (_func_int **)&PTR_GetProcessHandle_01379240;
  this->emptyStringPropertyRecord = (PropertyRecord *)0x0;
  this->noScriptScope = false;
  this->m_jitNumericProperties = (BVSparse<Memory::HeapAllocator> *)0x0;
  this->m_jitNeedsPropertyUpdate = false;
  this->threadContextFlags = ThreadContextFlagNoFlag;
  this->debugManager = (DebugManager *)0x0;
  this->heapEnum = (IActiveScriptProfilerHeapEnum *)0x0;
  this->propertyMap = (PropertyMap *)0x0;
  this->m_remoteThreadContextInfo = (PTHREADCONTEXT_HANDLE)0x0;
  this->m_prereservedRegionAddr = 0;
  DVar1 = GetCurrentThreadId();
  this->currentThreadId = DVar1;
  this->isThreadBound = false;
  this->hasThrownPendingException = false;
  this->stackLimitForCurrentThread = 0;
  this->stackProber = (StackProber *)0x0;
  this->hasBailedOutBitPtr = (bool *)0x0;
  *(undefined4 *)((long)&this->hasBailedOutBitPtr + 7) = 0;
  this->allocationPolicyManager = allocationPolicyManager;
  (this->threadService).threadService = threadServiceCallback;
  (this->threadService).isInCallback = false;
  autocs.cs = (CriticalSection *)&this->preReservedVirtualAllocator;
  Memory::PreReservedVirtualAllocWrapper::PreReservedVirtualAllocWrapper
            ((PreReservedVirtualAllocWrapper *)autocs.cs);
  this->callRootLevel = 0;
  Memory::
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::BackgroundPageQueue::BackgroundPageQueue(&this->backgroundPageQueue);
  this_00 = &this->pageAllocator;
  Memory::IdleDecommitPageAllocator::IdleDecommitPageAllocator
            (this_00,allocationPolicyManager,PageAllocatorType_Thread,
             (ConfigFlagsTable *)&Js::Configuration::Global,0,
             Memory::RecyclerHeuristic::Instance.DefaultMaxFreePageCount,false,
             &this->backgroundPageQueue,0x20,false);
  this->recycler = (Recycler *)0x0;
  (this->delayFreeCallback).listOfBuffers.
  super_SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>.
  super_SListNodeBase<Memory::HeapAllocator>.next = (Type)&this->delayFreeCallback;
  (this->delayFreeCallback).listOfBuffers.
  super_SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>.
  super_RealCount.count = 0;
  (this->delayFreeCallback).listOfBuffers.allocator = &Memory::HeapAllocator::Instance;
  this_01 = &this->threadAlloc;
  this->caseInvariantPropertySet = (PropertyNoCaseSetType *)0x0;
  this->rootPendingClose = (ScriptContext *)0x0;
  this->entryExitRecord = (ScriptEntryExitRecord *)0x0;
  this->leafInterpreterFrame = (InterpreterStackFrame *)0x0;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&this_01->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             L"TC",&this_00->super_PageAllocator,Js::Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  this->threadServiceWrapper = (ThreadServiceWrapper *)0x0;
  this->tryHandlerAddrOfReturnAddr = (void *)0x0;
  this->redeferralState = InitialRedeferralState;
  this->gcSinceLastRedeferral = 0;
  this->gcSinceCallCountsCollected = 0;
  this->nextTypeId = 0x800;
  this->polymorphicCacheState = 0;
  this->jobProcessor = (JobProcessor *)0x0;
  pVVar3 = GetCurrentProcess();
  Memory::CustomHeap::
  CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
  CodePageAllocators(&this->thunkPageAllocators,allocationPolicyManager,false,
                     (PreReservedVirtualAllocWrapper *)0x0,pVVar3);
  pVVar3 = GetCurrentProcess();
  Memory::CustomHeap::
  CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
  CodePageAllocators(&this->codePageAllocators,allocationPolicyManager,true,
                     (PreReservedVirtualAllocWrapper *)autocs.cs,pVVar3);
  this->topLevelScriptSite = (ScriptSite *)0x0;
  this->scriptContextList = (ScriptContext *)0x0;
  (this->recyclableData).ptr = (RecyclableData *)0x0;
  this->temporaryArenaAllocatorCount = 0;
  this->temporaryGuestArenaAllocatorCount = 0;
  this->scriptContextEverRegistered = false;
  (this->hTimer).data.cacheSysTime = 0.0;
  this->nativeCodeSize = 0;
  this->sourceCodeSize = 0;
  (this->hTimer).data.cacheTick = 0xffffffffffffffff;
  (this->hTimer).data.previousDifference = 0;
  this->stackProbeCount = 0;
  this->exceptionCode = 0;
  this_02 = &this->inlineCacheThreadInfoAllocator;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&this_02->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             L"TC-InlineCacheInfo",&this_00->super_PageAllocator,Js::Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&(this->isInstInlineCacheThreadInfoAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             L"TC-IsInstInlineCacheInfo",&this_00->super_PageAllocator,Js::Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&(this->equivalentTypeCacheInfoAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             L"TC-EquivalentTypeCacheInfo",&this_00->super_PageAllocator,Js::Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  (this->equivalentTypeCacheEntryPoints).super_DListNodeBase<Js::EntryPointInfo_*>.next.base =
       &(this->equivalentTypeCacheEntryPoints).super_DListNodeBase<Js::EntryPointInfo_*>;
  (this->equivalentTypeCacheEntryPoints).super_DListNodeBase<Js::EntryPointInfo_*>.prev.base =
       &(this->equivalentTypeCacheEntryPoints).super_DListNodeBase<Js::EntryPointInfo_*>;
  (this->equivalentTypeCacheEntryPoints).super_RealCount.count = 0;
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->protoInlineCacheByPropId,this_02,0x209);
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->storeFieldInlineCacheByPropId,this_02,0x125);
  this->registeredInlineCacheCount = 0;
  this->unregisteredInlineCacheCount = 0;
  JsUtil::
  BaseDictionary<void_*,_Js::IsInstInlineCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->isInstInlineCacheByFunction,&this->isInstInlineCacheThreadInfoAllocator,
                   0x83);
  (this->isConcatSpreadableCache).type0 = (Type *)0x0;
  (this->isConcatSpreadableCache).type1 = (Type *)0x0;
  (this->isConcatSpreadableCache).lastAccess = 1;
  (this->isConcatSpreadableCache).result0 = 0;
  (this->isConcatSpreadableCache).result1 = 0;
  Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::ThreadCacheRegistry
            (&this->noSpecialPropertyRegistry,&this_00->super_PageAllocator);
  Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
  ThreadCacheRegistry(&this->onlyWritablePropertyRegistry,&this_00->super_PageAllocator);
  (this->collectCallBackList).super_DListNodeBase<ThreadContext::CollectCallBack>.next.base =
       &(this->collectCallBackList).super_DListNodeBase<ThreadContext::CollectCallBack>;
  (this->collectCallBackList).super_DListNodeBase<ThreadContext::CollectCallBack>.prev.base =
       &(this->collectCallBackList).super_DListNodeBase<ThreadContext::CollectCallBack>;
  (this->collectCallBackList).super_RealCount.count = 0;
  CCLock::CCLock(&(this->csCollectionCallBack).super_CCLock,true);
  this->hasCollectionCallBack = false;
  this->isOptimizedForManyInstances = (bool)DAT_014594a4;
  this->bgJit = (bool)DAT_014303b1;
  this->isProfilingUserCode = true;
  this->jsrtRuntime = (void *)0x0;
  this->hasUnhandledException = false;
  this->hasCatchHandler = false;
  this->disableImplicitFlags = DisableImplicitNoFlag;
  this->hasCatchHandlerToUserCode = false;
  this->crefSContextForDiag = 0;
  (this->entropy).previousValue = 0;
  (this->entropy).u = (anon_union_4_2_f5ec4e19_for_u)0x0;
  (this->entropy).currentIndex = 0;
  this->standardUTF8Chars = (StandardChars<unsigned_char> *)0x0;
  this->standardUnicodeChars = (StandardChars<char16_t> *)0x0;
  CCLock::CCLock(&(this->csFunctionBody).super_CCLock,true);
  Js::Amd64ContextsManager::Amd64ContextsManager(&this->amd64ContextsManager);
  JsUtil::
  BaseDictionary<const_Js::DynamicType_*,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->dynamicObjectEnumeratorCacheMap,&Memory::HeapAllocator::Instance,0x10);
  (this->nativeLibraryEntry).head = (Entry *)0x0;
  UCrtC99MathApis::UCrtC99MathApis(&this->ucrtC99MathApis);
  this->loopDepth = '\0';
  ThreadConfiguration::ThreadConfiguration(&this->configuration,enableExperimentalFeatures);
  this->closedScriptContextCount = 0;
  this->visibilityState = Undefined;
  this->tridentLoadAddress = (void *)0x0;
  this->handlerPropertyId = -1;
  this->TTDContext = (ThreadContextTTD *)0x0;
  this->TTDExecutionInfo = (ExecutionInfoManager *)0x0;
  *(undefined8 *)((long)&this->TTDExecutionInfo + 4) = 0;
  *(undefined8 *)((long)&this->TTDLog + 4) = 0;
  this->expirableObjectList = (ExpirableObjectList *)0x0;
  this->expirableObjectDisposeList = (ExpirableObjectList *)0x0;
  this->numExpirableObjects = 0;
  this->expirableCollectModeGcCount = -1;
  this->disableExpiration = false;
  this->callDispose = true;
  this->bailOutByteCodeLocationCount = 0;
  this->interruptPoller = (InterruptPoller *)0x0;
  (this->entryPointToBuiltInOperationIdCache).buckets = (Type)0x0;
  (this->entryPointToBuiltInOperationIdCache).entries = (Type)0x0;
  (this->entryPointToBuiltInOperationIdCache).alloc = this_01;
  (this->entryPointToBuiltInOperationIdCache).size = 0;
  (this->entryPointToBuiltInOperationIdCache).bucketCount = 0;
  (this->entryPointToBuiltInOperationIdCache).count = 0;
  (this->entryPointToBuiltInOperationIdCache).freeCount = 0;
  (this->entryPointToBuiltInOperationIdCache).modFunctionIndex = 0x4b;
  (this->entryPointToBuiltInOperationIdCache).stats = (Type)0x0;
  (this->recyclerTelemetryHostInterface).super_RecyclerTelemetryHostInterface.
  _vptr_RecyclerTelemetryHostInterface = (_func_int **)&PTR_GetLastScriptExecutionEndTime_013792a8;
  (this->recyclerTelemetryHostInterface).tc = this;
  pSVar4 = (Stack<HostScriptContext_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *)
           new<Memory::ArenaAllocator>(0x30,this_01,0x35916e);
  (pSVar4->list).super_ReadOnlyList<HostScriptContext_*,_Memory::ArenaAllocator,_DefaultComparer>.
  alloc = this_01;
  (pSVar4->list).super_ReadOnlyList<HostScriptContext_*,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_01379a80;
  (pSVar4->list).super_ReadOnlyList<HostScriptContext_*,_Memory::ArenaAllocator,_DefaultComparer>.
  buffer = (Type)0x0;
  (pSVar4->list).super_ReadOnlyList<HostScriptContext_*,_Memory::ArenaAllocator,_DefaultComparer>.
  count = 0;
  (pSVar4->list).length = 0;
  (pSVar4->list).increment = 4;
  this->hostScriptContextStack = pSVar4;
  this->functionCount = 0;
  this->sourceInfoCount = 0;
  this->scriptContextCount = 0;
  this->isScriptActive = false;
  GetBailOutRegisterSaveSlotCount();
  uVar2 = GetBailOutRegisterSaveSlotCount();
  ppvVar5 = Memory::AllocateArray<Memory::ArenaAllocator,void*,false>
                      ((Memory *)this_01,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,
                       (ulong)uVar2);
  this->bailOutRegisterSaveSpace = ppvVar5;
  this->scriptSiteCount = 0;
  (this->pageAllocator).super_PageAllocator.debugName = L"Thread";
  pDVar6 = DynamicProfileMutator::GetMutator();
  this->dynamicProfileMutator = pDVar6;
  this->rootTrackerScriptContext = (ScriptContext *)0x0;
  DVar1 = GetCurrentThreadId();
  this->threadId = DVar1;
  local_50.cs = &s_csThreadContext;
  CCLock::Enter(&s_csThreadContext.super_CCLock);
  JsUtil::DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>::
  LinkToBeginning<ThreadContext>(this,&globalListFirst,&globalListLast);
  (this->pageAllocator).super_PageAllocator.threadContextHandle = this;
  this_03 = (ThreadContext *)(ulong)DAT_014594a8;
  if (DAT_014594a8 == 0) {
    this_03 = (ThreadContext *)time((time_t *)0x0);
  }
  this->arrayMutationSeed = (uint)this_03;
  srand((uint)this_03);
  InitAvailableCommit(this_03);
  AutoCriticalSection::~AutoCriticalSection(&local_50);
  return;
}

Assistant:

ThreadContext::ThreadContext(AllocationPolicyManager * allocationPolicyManager, JsUtil::ThreadService::ThreadServiceCallback threadServiceCallback, bool enableExperimentalFeatures) :
    currentThreadId(::GetCurrentThreadId()),
    stackLimitForCurrentThread(0),
    stackProber(nullptr),
    isThreadBound(false),
    hasThrownPendingException(false),
    hasBailedOutBitPtr(nullptr),
    noScriptScope(false),
    heapEnum(nullptr),
    threadContextFlags(ThreadContextFlagNoFlag),
    JsUtil::DoublyLinkedListElement<ThreadContext>(),
    allocationPolicyManager(allocationPolicyManager),
    threadService(threadServiceCallback),
    isOptimizedForManyInstances(Js::Configuration::Global.flags.OptimizeForManyInstances),
    bgJit(Js::Configuration::Global.flags.BgJit),
    pageAllocator(allocationPolicyManager, PageAllocatorType_Thread, Js::Configuration::Global.flags, 0, RecyclerHeuristic::Instance.DefaultMaxFreePageCount,
        false
#if ENABLE_BACKGROUND_PAGE_FREEING
        , &backgroundPageQueue
#endif
        ),
    recycler(nullptr),
    hasCollectionCallBack(false),
    callDispose(true),
#if ENABLE_NATIVE_CODEGEN
    jobProcessor(nullptr),
#endif
    interruptPoller(nullptr),
    expirableCollectModeGcCount(-1),
    expirableObjectList(nullptr),
    expirableObjectDisposeList(nullptr),
    numExpirableObjects(0),
    disableExpiration(false),
    callRootLevel(0),
    nextTypeId((Js::TypeId)Js::Constants::ReservedTypeIds),
    entryExitRecord(nullptr),
    leafInterpreterFrame(nullptr),
    threadServiceWrapper(nullptr),
    tryHandlerAddrOfReturnAddr(nullptr),
    temporaryArenaAllocatorCount(0),
    temporaryGuestArenaAllocatorCount(0),
    crefSContextForDiag(0),
    m_prereservedRegionAddr(0),
    scriptContextList(nullptr),
    scriptContextEverRegistered(false),
#if DBG_DUMP || defined(PROFILE_EXEC)
    topLevelScriptSite(nullptr),
#endif
    polymorphicCacheState(0),
    stackProbeCount(0),
#ifdef BAILOUT_INJECTION
    bailOutByteCodeLocationCount(0),
#endif
    sourceCodeSize(0),
    nativeCodeSize(0),
    threadAlloc(_u("TC"), GetPageAllocator(), Js::Throw::OutOfMemory),
    inlineCacheThreadInfoAllocator(_u("TC-InlineCacheInfo"), GetPageAllocator(), Js::Throw::OutOfMemory),
    isInstInlineCacheThreadInfoAllocator(_u("TC-IsInstInlineCacheInfo"), GetPageAllocator(), Js::Throw::OutOfMemory),
    equivalentTypeCacheInfoAllocator(_u("TC-EquivalentTypeCacheInfo"), GetPageAllocator(), Js::Throw::OutOfMemory),
    protoInlineCacheByPropId(&inlineCacheThreadInfoAllocator, 521),
    storeFieldInlineCacheByPropId(&inlineCacheThreadInfoAllocator, 293),
    isInstInlineCacheByFunction(&isInstInlineCacheThreadInfoAllocator, 131),
    registeredInlineCacheCount(0),
    unregisteredInlineCacheCount(0),
    noSpecialPropertyRegistry(this->GetPageAllocator()),
    onlyWritablePropertyRegistry(this->GetPageAllocator()),
    standardUTF8Chars(0),
    standardUnicodeChars(0),
    hasUnhandledException(FALSE),
    hasCatchHandler(FALSE),
    disableImplicitFlags(DisableImplicitNoFlag),
    hasCatchHandlerToUserCode(false),
    caseInvariantPropertySet(nullptr),
    entryPointToBuiltInOperationIdCache(&threadAlloc, 0),
#if ENABLE_NATIVE_CODEGEN
    preReservedVirtualAllocator(),
#if !FLOATVAR
    codeGenNumberThreadAllocator(nullptr),
    xProcNumberPageSegmentManager(nullptr),
#endif
    m_jitNumericProperties(nullptr),
    m_jitNeedsPropertyUpdate(false),
#if DYNAMIC_INTERPRETER_THUNK || defined(ASMJS_PLAT)
    thunkPageAllocators(allocationPolicyManager, /* allocXData */ false, /* virtualAllocator */ nullptr, GetCurrentProcess()),
#endif
    codePageAllocators(allocationPolicyManager, ALLOC_XDATA, GetPreReservedVirtualAllocator(), GetCurrentProcess()),
#if defined(_CONTROL_FLOW_GUARD) && !defined(_M_ARM)
    jitThunkEmitter(this, &VirtualAllocWrapper::Instance , GetCurrentProcess()),
#endif
#endif
    dynamicObjectEnumeratorCacheMap(&HeapAllocator::Instance, 16),
    //threadContextFlags(ThreadContextFlagNoFlag),
#ifdef NTBUILD
    telemetryBlock(&localTelemetryBlock),
#endif
    configuration(enableExperimentalFeatures),
    jsrtRuntime(nullptr),
    propertyMap(nullptr),
    rootPendingClose(nullptr),
    exceptionCode(0),
    isProfilingUserCode(true),
    loopDepth(0),
    redeferralState(InitialRedeferralState),
    gcSinceLastRedeferral(0),
    gcSinceCallCountsCollected(0),
    tridentLoadAddress(nullptr),
    m_remoteThreadContextInfo(nullptr)
#ifdef ENABLE_SCRIPT_DEBUGGING
    , debugManager(nullptr)
#endif
#if ENABLE_TTD
    , TTDContext(nullptr)
    , TTDExecutionInfo(nullptr)
    , TTDLog(nullptr)
    , TTDRootNestingCount(0)
#endif
#ifdef ENABLE_DIRECTCALL_TELEMETRY
    , directCallTelemetry(this)
#endif
#if ENABLE_JS_REENTRANCY_CHECK
    , noJsReentrancy(false)
#endif
    , emptyStringPropertyRecord(nullptr)
    , recyclerTelemetryHostInterface(this)
    , reentrancySafeOrHandled(false)
    , isInReentrancySafeRegion(false)
    , closedScriptContextCount(0)
    , visibilityState(VisibilityState::Undefined)
{
    hostScriptContextStack = Anew(GetThreadAlloc(), JsUtil::Stack<HostScriptContext*>, GetThreadAlloc());

    functionCount = 0;
    sourceInfoCount = 0;
#if DBG || defined(RUNTIME_DATA_COLLECTION)
    scriptContextCount = 0;
#endif
    isScriptActive = false;

#ifdef ENABLE_CUSTOM_ENTROPY
    entropy.Initialize();
#endif

#if ENABLE_NATIVE_CODEGEN
    this->bailOutRegisterSaveSpace = AnewArrayZ(this->GetThreadAlloc(), Js::Var, GetBailOutRegisterSaveSlotCount());
#endif

#if DBG_DUMP
    scriptSiteCount = 0;
    pageAllocator.debugName = _u("Thread");
#endif
#ifdef DYNAMIC_PROFILE_MUTATOR
    this->dynamicProfileMutator = DynamicProfileMutator::GetMutator();
#endif

    PERF_COUNTER_INC(Basic, ThreadContext);

#ifdef LEAK_REPORT
    this->rootTrackerScriptContext = nullptr;
    this->threadId = ::GetCurrentThreadId();
#endif

#ifdef NTBUILD
    memset(&localTelemetryBlock, 0, sizeof(localTelemetryBlock));
#endif

    AutoCriticalSection autocs(ThreadContext::GetCriticalSection());
    ThreadContext::LinkToBeginning(this, &ThreadContext::globalListFirst, &ThreadContext::globalListLast);
#if DBG
    // Since we created our page allocator while we were constructing this thread context
    // it will pick up the thread context id that is current on the thread. We need to update
    // that now.
    pageAllocator.UpdateThreadContextHandle((ThreadContextId)this);
#endif

#if DBG
    arrayMutationSeed = (Js::Configuration::Global.flags.ArrayMutationTestSeed != 0) ? (uint)Js::Configuration::Global.flags.ArrayMutationTestSeed : (uint)time(NULL);
    srand(arrayMutationSeed);
#endif

    this->InitAvailableCommit();
}